

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_concat(StringBuffer *s,JSString *p,uint32_t from,uint32_t to)

{
  uint in_ECX;
  uint in_EDX;
  StringBuffer *in_RSI;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_EDX < in_ECX) {
    if ((*(ulong *)((long)&in_RSI->ctx + 4) >> 0x1f & 1) == 0) {
      local_4 = string_buffer_write8
                          (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffdc);
    }
    else {
      local_4 = string_buffer_write16
                          (in_RSI,(uint16_t *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffdc);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int string_buffer_concat(StringBuffer *s, const JSString *p,
                                uint32_t from, uint32_t to)
{
    if (to <= from)
        return 0;
    if (p->is_wide_char)
        return string_buffer_write16(s, p->u.str16 + from, to - from);
    else
        return string_buffer_write8(s, p->u.str8 + from, to - from);
}